

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O0

void __thiscall deci_FlexLexer::~deci_FlexLexer(deci_FlexLexer *this)

{
  yy_buffer_state *local_38;
  deci_FlexLexer *this_local;
  
  (this->super_FlexLexer)._vptr_FlexLexer = (_func_int **)&PTR__deci_FlexLexer_0013ac78;
  if (this->yy_state_buf != (yy_state_type *)0x0) {
    operator_delete__(this->yy_state_buf);
  }
  deci_free(this->yy_start_stack);
  if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
    local_38 = (yy_buffer_state *)0x0;
  }
  else {
    local_38 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  (*(this->super_FlexLexer)._vptr_FlexLexer[5])(this,local_38);
  deci_free(this->yy_buffer_stack);
  std::ostream::~ostream(&this->yyout);
  std::istream::~istream(&this->yyin);
  FlexLexer::~FlexLexer(&this->super_FlexLexer);
  return;
}

Assistant:

yyFlexLexer::~yyFlexLexer()
{
	delete [] yy_state_buf;
	yyfree( yy_start_stack  );
	yy_delete_buffer( YY_CURRENT_BUFFER );
	yyfree( yy_buffer_stack  );
}